

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pnglite.c
# Opt level: O0

void png_filter_paeth(int stride,uchar *in,uchar *out,uchar *prev_line,int len)

{
  char cVar1;
  uchar uVar2;
  long in_RCX;
  long in_RDX;
  long in_RSI;
  int in_EDI;
  int in_R8D;
  uchar c;
  uchar b;
  uchar a;
  int i;
  undefined1 local_2b;
  undefined1 local_2a;
  undefined1 local_29;
  undefined4 local_28;
  
  for (local_28 = 0; local_28 < in_R8D; local_28 = local_28 + 1) {
    if ((in_RCX == 0) || (local_28 < in_EDI)) {
      if (in_RCX == 0) {
        local_2a = '\0';
      }
      else {
        local_2a = *(uchar *)(in_RCX + local_28);
      }
      if (local_28 < in_EDI) {
        local_29 = '\0';
      }
      else {
        local_29 = *(uchar *)(in_RDX + (local_28 - in_EDI));
      }
      local_2b = '\0';
    }
    else {
      local_29 = *(uchar *)(in_RDX + (local_28 - in_EDI));
      local_2a = *(uchar *)(in_RCX + local_28);
      local_2b = *(uchar *)(in_RCX + (local_28 - in_EDI));
    }
    cVar1 = *(char *)(in_RSI + local_28);
    uVar2 = png_paeth(local_29,local_2a,local_2b);
    *(uchar *)(in_RDX + local_28) = cVar1 + uVar2;
  }
  return;
}

Assistant:

static void png_filter_paeth(int stride, unsigned char* in, unsigned char* out, unsigned char* prev_line, int len)
{
	int i;
	unsigned char a;
	unsigned char b;
	unsigned char c;

	for(i = 0; i < len; i++)
	{
		if(prev_line && i >= stride)
		{
			a = out[i - stride];
			b = prev_line[i];
			c = prev_line[i - stride];
		}
		else
		{
			if(prev_line)
				b = prev_line[i];
			else
				b = 0;
	
			if(i >= stride)
				a = out[i - stride];
			else
				a = 0;

			c = 0;
		}

		out[i] = in[i] + png_paeth(a, b, c);
	}
}